

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server.cpp
# Opt level: O3

void __thiscall echo_server::connection::connection(connection *this,echo_server *parent)

{
  timer *t;
  undefined8 local_98;
  undefined8 uStack_90;
  code *local_88;
  undefined8 uStack_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  connection *local_58;
  undefined8 local_50;
  code *local_48;
  code *local_40;
  connection *local_38;
  char local_30 [8];
  code *local_28;
  code *local_20;
  
  this->parent = parent;
  local_30[0] = '\0';
  local_30[1] = '\0';
  local_30[2] = '\0';
  local_30[3] = '\0';
  local_30[4] = '\0';
  local_30[5] = '\0';
  local_30[6] = '\0';
  local_30[7] = '\0';
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/echo_server.cpp:10:32)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/echo_server.cpp:10:32)>
             ::_M_manager;
  local_50 = 0;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/echo_server.cpp:12:8)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/echo_server.cpp:12:8)>
             ::_M_manager;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = (code *)0x0;
  uStack_80 = 0;
  local_58 = this;
  local_38 = this;
  server_socket::accept
            ((server_socket *)&this->socket,(int)parent + 8,(sockaddr *)&local_38,
             (socklen_t *)&local_58);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,3);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  t = sysapi::epoll::get_timer(parent->ep);
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/echo_server.cpp:15:46)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/echo_server.cpp:15:46)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  timer_element::timer_element(&this->timer,t,(duration)0x37e11d600,(callback_t *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  this->start_offset = 0;
  this->end_offset = 0;
  return;
}

Assistant:

echo_server::connection::connection(echo_server *parent)
    : parent(parent)
    , socket(parent->ss.accept([this] {
        this->parent->connections.erase(this);
    }, [this] {
        process(true);
    }, client_socket::on_ready_t{}))
    , timer(parent->ep.get_timer(), timeout, [this] {
        this->parent->connections.erase(this);
    })
    , start_offset()
    , end_offset()
{}